

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

DdNode ** Aig_ManCreateOutputs(DdManager *dd,Aig_Man_t *p)

{
  int iVar1;
  DdNode **ppDVar2;
  Aig_Obj_t *pObj;
  DdNode *pDVar3;
  int local_2c;
  int i;
  Aig_Obj_t *pNode;
  DdNode **pbOutputs;
  Aig_Man_t *p_local;
  DdManager *dd_local;
  
  iVar1 = Saig_ManPoNum(p);
  ppDVar2 = (DdNode **)malloc((long)iVar1 << 3);
  for (local_2c = 0; iVar1 = Saig_ManPoNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pDVar3 = Aig_ObjGlobalBdd(pObj);
    ppDVar2[local_2c] = pDVar3;
    Cudd_Ref(ppDVar2[local_2c]);
  }
  return ppDVar2;
}

Assistant:

DdNode ** Aig_ManCreateOutputs( DdManager * dd, Aig_Man_t * p )
{
    DdNode ** pbOutputs;
    Aig_Obj_t * pNode;
    int i;
    // compute the transition relation
    pbOutputs = ABC_ALLOC( DdNode *, Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pNode, i )
    {
        pbOutputs[i] = Aig_ObjGlobalBdd(pNode);  Cudd_Ref( pbOutputs[i] );
    }
    return pbOutputs;
}